

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

int ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_MAC(ImGuiInputTextState *obj,int idx)

{
  int iVar1;
  bool bVar2;
  int local_20;
  int local_14;
  int len;
  int idx_local;
  ImGuiInputTextState *obj_local;
  
  local_14 = idx + 1;
  local_20 = obj->CurLenW;
  while( true ) {
    bVar2 = false;
    if (local_14 < local_20) {
      iVar1 = is_word_boundary_from_left(obj,local_14);
      bVar2 = iVar1 == 0;
    }
    if (!bVar2) break;
    local_14 = local_14 + 1;
  }
  if (local_14 <= local_20) {
    local_20 = local_14;
  }
  return local_20;
}

Assistant:

static int  STB_TEXTEDIT_MOVEWORDRIGHT_MAC(ImGuiInputTextState* obj, int idx)   { idx++; int len = obj->CurLenW; while (idx < len && !is_word_boundary_from_left(obj, idx)) idx++; return idx > len ? len : idx; }